

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZendParser.cpp
# Opt level: O2

void __thiscall phpconvert::ZendParser::replaceTypes(ZendParser *this,File *file)

{
  pointer pPVar1;
  PreparedType *type;
  pointer type_00;
  
  pPVar1 = (file->prepTypes).
           super__Vector_base<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (type_00 = (file->prepTypes).
                 super__Vector_base<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
                 ._M_impl.super__Vector_impl_data._M_start; type_00 != pPVar1; type_00 = type_00 + 1
      ) {
    replaceType(this,type_00,file);
  }
  return;
}

Assistant:

void ZendParser::replaceTypes(File &file) {
//        vector<PreparedType> tmp;
        for (PreparedType &type: file.prepTypes) {
//		cout << type.type + "-" +type.alias + "\n";
//            if (isBuiltInType(type)) {
            replaceType(type, file);
//            }
        }
    }